

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O0

void get_msurf_descriptor_haar_unroll_1_1_True(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  float *in_RSI;
  integral_image *in_RDI;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int k_2;
  int gauss_index_k;
  float gauss_s1_y;
  int l_2;
  int gauss_index_l_inc;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float *j_arr;
  int j;
  int gauss_index_k_inc;
  int gauss_index_k_start;
  float *i_arr;
  int i;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  int sample_x_sub_int_scale0_1;
  int k_count0_1;
  int k0_1;
  int k_count_1;
  int k_1;
  int sample_y_sub_int_scale0_1;
  int l_count0_1;
  int l0_1;
  int l_count_1;
  int l_1;
  int sample_x_sub_int_scale0;
  float ipoint_x_sub_int_scale_add_k0_mul_scale;
  int k_count0;
  int k0;
  int k_count;
  int k;
  int sample_y_sub_int_scale0;
  float ipoint_y_sub_int_scale_add_l0_mul_scale;
  int l_count0;
  int l0;
  int l_count;
  int l;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int height;
  int width;
  float ipoint_y_sub_int_scale_add_05;
  float ipoint_x_sub_int_scale_add_05;
  float ipoint_y_sub_int_scale;
  float ipoint_x_sub_int_scale;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  double local_1c0;
  double local_1a8;
  int local_19c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  float *local_140;
  int local_134;
  float *local_128;
  int local_120;
  int local_a0;
  int local_9c;
  int local_8c;
  int local_88;
  int local_70;
  int local_58;
  int local_54;
  float local_50;
  int local_4c;
  
  fVar33 = in_RSI[2];
  auVar26._8_4_ = 0x80000000;
  auVar26._0_8_ = 0x8000000080000000;
  auVar26._12_4_ = 0x80000000;
  auVar20._8_4_ = 0x3effffff;
  auVar20._0_8_ = 0x3effffff3effffff;
  auVar20._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar20,ZEXT416((uint)fVar33),auVar26,0xf8);
  auVar18 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)(fVar33 + auVar18._0_4_)),0xb);
  iVar12 = (int)auVar18._0_4_;
  fVar28 = -0.08 / (fVar33 * fVar33);
  fVar30 = *in_RSI;
  auVar27._8_4_ = 0x80000000;
  auVar27._0_8_ = 0x8000000080000000;
  auVar27._12_4_ = 0x80000000;
  auVar21._8_4_ = 0x3effffff;
  auVar21._0_8_ = 0x3effffff3effffff;
  auVar21._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar21,ZEXT416((uint)fVar30),auVar27,0xf8);
  auVar18 = vroundss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)(fVar30 + auVar18._0_4_)),0xb);
  auVar24._0_8_ = (double)auVar18._0_4_;
  auVar24._8_8_ = 0;
  auVar18._0_8_ = (double)fVar33;
  auVar18._8_8_ = 0;
  auVar18 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar18,auVar24);
  fVar29 = (float)auVar18._0_8_;
  fVar30 = in_RSI[1];
  auVar68._8_4_ = 0x80000000;
  auVar68._0_8_ = 0x8000000080000000;
  auVar68._12_4_ = 0x80000000;
  auVar22._8_4_ = 0x3effffff;
  auVar22._0_8_ = 0x3effffff3effffff;
  auVar22._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar22,ZEXT416((uint)fVar30),auVar68,0xf8);
  auVar18 = vroundss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)(fVar30 + auVar18._0_4_)),0xb);
  auVar25._0_8_ = (double)auVar18._0_4_;
  auVar25._8_8_ = 0;
  auVar19._0_8_ = (double)fVar33;
  auVar19._8_8_ = 0;
  auVar18 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar19,auVar25);
  fVar30 = (float)auVar18._0_8_;
  local_4c = 0;
  local_50 = 0.0;
  local_54 = 0;
  auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar33),
                            ZEXT416((uint)fVar29));
  auVar69._8_4_ = 0x80000000;
  auVar69._0_8_ = 0x8000000080000000;
  auVar69._12_4_ = 0x80000000;
  auVar23._8_4_ = 0x3effffff;
  auVar23._0_8_ = 0x3effffff3effffff;
  auVar23._12_4_ = 0x3effffff;
  auVar19 = vpternlogd_avx512vl(auVar23,auVar18,auVar69,0xf8);
  auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
  auVar46 = ZEXT1664(auVar18);
  if (0 < (int)auVar18._0_4_ - iVar12) {
    auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar33),
                              ZEXT416((uint)fVar30));
    auVar70._8_4_ = 0x80000000;
    auVar70._0_8_ = 0x8000000080000000;
    auVar70._12_4_ = 0x80000000;
    auVar47._8_4_ = 0x3effffff;
    auVar47._0_8_ = 0x3effffff3effffff;
    auVar47._12_4_ = 0x3effffff;
    auVar19 = vpternlogd_avx512vl(auVar47,auVar18,auVar70,0xf8);
    auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
    auVar46 = ZEXT1664(auVar18);
    if (0 < (int)auVar18._0_4_ - iVar12) {
      auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar33),
                                ZEXT416((uint)fVar29));
      auVar71._8_4_ = 0x80000000;
      auVar71._0_8_ = 0x8000000080000000;
      auVar71._12_4_ = 0x80000000;
      auVar48._8_4_ = 0x3effffff;
      auVar48._0_8_ = 0x3effffff3effffff;
      auVar48._12_4_ = 0x3effffff;
      auVar19 = vpternlogd_avx512vl(auVar48,auVar18,auVar71,0xf8);
      auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
      auVar46 = ZEXT1664(auVar18);
      if ((int)auVar18._0_4_ + iVar12 <= in_RDI->width) {
        auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar33),
                                  ZEXT416((uint)fVar30));
        auVar72._8_4_ = 0x80000000;
        auVar72._0_8_ = 0x8000000080000000;
        auVar72._12_4_ = 0x80000000;
        auVar49._8_4_ = 0x3effffff;
        auVar49._0_8_ = 0x3effffff3effffff;
        auVar49._12_4_ = 0x3effffff;
        auVar19 = vpternlogd_avx512vl(auVar49,auVar18,auVar72,0xf8);
        auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
        auVar46 = ZEXT1664(auVar18);
        if ((int)auVar18._0_4_ + iVar12 <= in_RDI->height) {
          local_8c = 0;
          for (local_88 = -0xc; local_88 < 0xc; local_88 = local_88 + 1) {
            auVar52._0_4_ = (float)local_88;
            auVar52._4_12_ = auVar46._4_12_;
            auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar52,
                                      ZEXT416((uint)((fVar30 - (float)iVar12) + 0.5)));
            auVar46 = ZEXT1664(auVar18);
            local_a0 = 0;
            for (local_9c = -0xc; local_9c < 0xc; local_9c = local_9c + 1) {
              auVar53._0_4_ = (float)local_9c;
              auVar53._4_12_ = auVar46._4_12_;
              auVar19 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar53,
                                        ZEXT416((uint)((fVar29 - (float)iVar12) + 0.5)));
              auVar46 = ZEXT1664(auVar19);
              haarXY_unconditional
                        (in_RDI,(int)auVar18._0_4_,(int)auVar19._0_4_,iVar12,
                         haarResponseX + (local_8c * 0x18 + local_a0),
                         haarResponseY + (local_8c * 0x18 + local_a0));
              local_a0 = local_a0 + 1;
            }
            local_8c = local_8c + 1;
          }
          goto LAB_001a2d59;
        }
      }
    }
  }
  for (local_58 = -0xc; local_58 < 0xc; local_58 = local_58 + 1) {
    auVar50._0_4_ = (float)local_58;
    auVar50._4_12_ = auVar46._4_12_;
    auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar50,ZEXT416((uint)(fVar30 - (float)iVar12)))
    ;
    local_1a8 = 0.5;
    if (auVar18._0_4_ < 0.0) {
      local_1a8 = -0.5;
    }
    auVar46 = ZEXT864((ulong)((double)auVar18._0_4_ + local_1a8));
    for (local_70 = -0xc; local_70 < 0xc; local_70 = local_70 + 1) {
      auVar51._0_4_ = (float)local_70;
      auVar51._4_12_ = auVar46._4_12_;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar51,
                                ZEXT416((uint)(fVar29 - (float)iVar12)));
      local_1c0 = 0.5;
      if (auVar18._0_4_ < 0.0) {
        local_1c0 = -0.5;
      }
      auVar46 = ZEXT864((ulong)((double)auVar18._0_4_ + local_1c0));
      haarXY_precheck_boundaries
                ((integral_image *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                 (float *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (float *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
  }
LAB_001a2d59:
  auVar34._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar34._0_4_ = fVar33 * 0.5;
  auVar73._8_4_ = 0x80000000;
  auVar73._0_8_ = 0x8000000080000000;
  auVar73._12_4_ = 0x80000000;
  auVar54._8_4_ = 0x3effffff;
  auVar54._0_8_ = 0x3effffff3effffff;
  auVar54._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar54,auVar34,auVar73,0xf8);
  auVar18 = vroundss_avx(auVar34,ZEXT416((uint)(fVar33 * 0.5 + auVar18._0_4_)),0xb);
  auVar35._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar35._0_4_ = fVar33 * 1.5;
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar55._8_4_ = 0x3effffff;
  auVar55._0_8_ = 0x3effffff3effffff;
  auVar55._12_4_ = 0x3effffff;
  auVar19 = vpternlogd_avx512vl(auVar55,auVar35,auVar74,0xf8);
  auVar19 = vroundss_avx(auVar35,ZEXT416((uint)(fVar33 * 1.5 + auVar19._0_4_)),0xb);
  auVar36._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar36._0_4_ = fVar33 * 2.5;
  auVar75._8_4_ = 0x80000000;
  auVar75._0_8_ = 0x8000000080000000;
  auVar75._12_4_ = 0x80000000;
  auVar56._8_4_ = 0x3effffff;
  auVar56._0_8_ = 0x3effffff3effffff;
  auVar56._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar56,auVar36,auVar75,0xf8);
  auVar20 = vroundss_avx(auVar36,ZEXT416((uint)(fVar33 * 2.5 + auVar20._0_4_)),0xb);
  fVar31 = auVar20._0_4_;
  auVar37._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar37._0_4_ = fVar33 * 3.5;
  auVar76._8_4_ = 0x80000000;
  auVar76._0_8_ = 0x8000000080000000;
  auVar76._12_4_ = 0x80000000;
  auVar57._8_4_ = 0x3effffff;
  auVar57._0_8_ = 0x3effffff3effffff;
  auVar57._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar57,auVar37,auVar76,0xf8);
  auVar20 = vroundss_avx(auVar37,ZEXT416((uint)(fVar33 * 3.5 + auVar20._0_4_)),0xb);
  auVar38._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar38._0_4_ = fVar33 * 4.5;
  auVar77._8_4_ = 0x80000000;
  auVar77._0_8_ = 0x8000000080000000;
  auVar77._12_4_ = 0x80000000;
  auVar58._8_4_ = 0x3effffff;
  auVar58._0_8_ = 0x3effffff3effffff;
  auVar58._12_4_ = 0x3effffff;
  auVar21 = vpternlogd_avx512vl(auVar58,auVar38,auVar77,0xf8);
  auVar21 = vroundss_avx(auVar38,ZEXT416((uint)(fVar33 * 4.5 + auVar21._0_4_)),0xb);
  auVar39._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar39._0_4_ = fVar33 * 5.5;
  auVar78._8_4_ = 0x80000000;
  auVar78._0_8_ = 0x8000000080000000;
  auVar78._12_4_ = 0x80000000;
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  auVar22 = vpternlogd_avx512vl(auVar59,auVar39,auVar78,0xf8);
  auVar22 = vroundss_avx(auVar39,ZEXT416((uint)(fVar33 * 5.5 + auVar22._0_4_)),0xb);
  auVar40._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar40._0_4_ = fVar33 * 6.5;
  auVar79._8_4_ = 0x80000000;
  auVar79._0_8_ = 0x8000000080000000;
  auVar79._12_4_ = 0x80000000;
  auVar60._8_4_ = 0x3effffff;
  auVar60._0_8_ = 0x3effffff3effffff;
  auVar60._12_4_ = 0x3effffff;
  auVar23 = vpternlogd_avx512vl(auVar60,auVar40,auVar79,0xf8);
  auVar23 = vroundss_avx(auVar40,ZEXT416((uint)(fVar33 * 6.5 + auVar23._0_4_)),0xb);
  auVar41._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar41._0_4_ = fVar33 * 7.5;
  auVar80._8_4_ = 0x80000000;
  auVar80._0_8_ = 0x8000000080000000;
  auVar80._12_4_ = 0x80000000;
  auVar61._8_4_ = 0x3effffff;
  auVar61._0_8_ = 0x3effffff3effffff;
  auVar61._12_4_ = 0x3effffff;
  auVar24 = vpternlogd_avx512vl(auVar61,auVar41,auVar80,0xf8);
  auVar24 = vroundss_avx(auVar41,ZEXT416((uint)(fVar33 * 7.5 + auVar24._0_4_)),0xb);
  fVar32 = auVar24._0_4_;
  auVar42._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar42._0_4_ = fVar33 * 8.5;
  auVar81._8_4_ = 0x80000000;
  auVar81._0_8_ = 0x8000000080000000;
  auVar81._12_4_ = 0x80000000;
  auVar62._8_4_ = 0x3effffff;
  auVar62._0_8_ = 0x3effffff3effffff;
  auVar62._12_4_ = 0x3effffff;
  auVar24 = vpternlogd_avx512vl(auVar62,auVar42,auVar81,0xf8);
  auVar24 = vroundss_avx(auVar42,ZEXT416((uint)(fVar33 * 8.5 + auVar24._0_4_)),0xb);
  auVar43._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar43._0_4_ = fVar33 * 9.5;
  auVar82._8_4_ = 0x80000000;
  auVar82._0_8_ = 0x8000000080000000;
  auVar82._12_4_ = 0x80000000;
  auVar63._8_4_ = 0x3effffff;
  auVar63._0_8_ = 0x3effffff3effffff;
  auVar63._12_4_ = 0x3effffff;
  auVar25 = vpternlogd_avx512vl(auVar63,auVar43,auVar82,0xf8);
  auVar25 = vroundss_avx(auVar43,ZEXT416((uint)(fVar33 * 9.5 + auVar25._0_4_)),0xb);
  auVar44._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar44._0_4_ = fVar33 * 10.5;
  auVar83._8_4_ = 0x80000000;
  auVar83._0_8_ = 0x8000000080000000;
  auVar83._12_4_ = 0x80000000;
  auVar64._8_4_ = 0x3effffff;
  auVar64._0_8_ = 0x3effffff3effffff;
  auVar64._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar64,auVar44,auVar83,0xf8);
  auVar26 = vroundss_avx(auVar44,ZEXT416((uint)(fVar33 * 10.5 + auVar26._0_4_)),0xb);
  auVar45._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar45._0_4_ = fVar33 * 11.5;
  auVar84._8_4_ = 0x80000000;
  auVar84._0_8_ = 0x8000000080000000;
  auVar84._12_4_ = 0x80000000;
  auVar65._8_4_ = 0x3effffff;
  auVar65._0_8_ = 0x3effffff3effffff;
  auVar65._12_4_ = 0x3effffff;
  auVar27 = vpternlogd_avx512vl(auVar65,auVar45,auVar84,0xf8);
  auVar27 = vroundss_avx(auVar45,ZEXT416((uint)(fVar33 * 11.5 + auVar27._0_4_)),0xb);
  fVar33 = fVar31 + auVar19._0_4_;
  fVar30 = fVar31 + auVar18._0_4_;
  fVar29 = fVar31 - auVar18._0_4_;
  fVar1 = fVar31 - auVar19._0_4_;
  fVar2 = fVar31 - auVar20._0_4_;
  fVar3 = fVar31 - auVar21._0_4_;
  fVar4 = fVar31 - auVar22._0_4_;
  fVar31 = fVar31 - auVar23._0_4_;
  fVar5 = fVar32 - auVar20._0_4_;
  fVar6 = fVar32 - auVar21._0_4_;
  fVar7 = fVar32 - auVar22._0_4_;
  fVar8 = fVar32 - auVar23._0_4_;
  fVar9 = fVar32 - auVar24._0_4_;
  fVar10 = fVar32 - auVar25._0_4_;
  fVar11 = fVar32 - auVar26._0_4_;
  fVar32 = fVar32 - auVar27._0_4_;
  gauss_s1_c0[0] = expf(fVar28 * fVar33 * fVar33);
  gauss_s1_c0[1] = expf(fVar28 * fVar30 * fVar30);
  gauss_s1_c0[2] = expf(fVar28 * fVar29 * fVar29);
  gauss_s1_c0[3] = expf(fVar28 * fVar1 * fVar1);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar28 * fVar2 * fVar2);
  gauss_s1_c0[6] = expf(fVar28 * fVar3 * fVar3);
  gauss_s1_c0[7] = expf(fVar28 * fVar4 * fVar4);
  gauss_s1_c0[8] = expf(fVar28 * fVar31 * fVar31);
  gauss_s1_c1[0] = expf(fVar28 * fVar5 * fVar5);
  gauss_s1_c1[1] = expf(fVar28 * fVar6 * fVar6);
  gauss_s1_c1[2] = expf(fVar28 * fVar7 * fVar7);
  gauss_s1_c1[3] = expf(fVar28 * fVar8 * fVar8);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar28 * fVar9 * fVar9);
  gauss_s1_c1[6] = expf(fVar28 * fVar10 * fVar10);
  gauss_s1_c1[7] = expf(fVar28 * fVar11 * fVar11);
  gauss_s1_c1[8] = expf(fVar28 * fVar32 * fVar32);
  for (local_120 = -8; local_120 < 8; local_120 = local_120 + 5) {
    if ((local_120 == -8) || (local_120 == 7)) {
      local_128 = gauss_s1_c1;
    }
    else {
      local_128 = gauss_s1_c0;
    }
    iVar12 = 0;
    if (local_120 < 0) {
      iVar12 = 8;
    }
    iVar13 = 1;
    if (local_120 < 0) {
      iVar13 = -1;
    }
    for (local_134 = -8; local_134 < 8; local_134 = local_134 + 5) {
      if ((local_134 == -8) || (local_134 == 7)) {
        local_140 = gauss_s1_c1;
      }
      else {
        local_140 = gauss_s1_c0;
      }
      local_144 = 0.0;
      local_148 = 0.0;
      local_14c = 0.0;
      local_150 = 0.0;
      local_154 = 0;
      if (local_134 < 0) {
        local_154 = 8;
      }
      iVar14 = 1;
      if (local_134 < 0) {
        iVar14 = -1;
      }
      for (iVar15 = (local_134 + 8) * 0x18;
          SBORROW4(iVar15,(local_134 + 0x11) * 0x18) != iVar15 + (local_134 + 0x11) * -0x18 < 0;
          iVar15 = iVar15 + 0x18) {
        iVar17 = iVar12;
        for (iVar16 = local_120 + 8; iVar16 < local_120 + 0x11; iVar16 = iVar16 + 1) {
          fVar33 = local_128[iVar17] * local_140[local_154] * haarResponseY[iVar15 + iVar16];
          fVar30 = local_128[iVar17] * local_140[local_154] * haarResponseX[iVar15 + iVar16];
          local_144 = fVar33 + local_144;
          local_148 = fVar30 + local_148;
          auVar66._8_4_ = 0x7fffffff;
          auVar66._0_8_ = 0x7fffffff7fffffff;
          auVar66._12_4_ = 0x7fffffff;
          auVar18 = vpand_avx(ZEXT416((uint)fVar33),auVar66);
          local_14c = auVar18._0_4_ + local_14c;
          auVar67._8_4_ = 0x7fffffff;
          auVar67._0_8_ = 0x7fffffff7fffffff;
          auVar67._12_4_ = 0x7fffffff;
          auVar18 = vpand_avx(ZEXT416((uint)fVar30),auVar67);
          local_150 = auVar18._0_4_ + local_150;
          iVar17 = iVar13 + iVar17;
        }
        local_154 = iVar14 + local_154;
      }
      fVar33 = gauss_s2_arr[local_54];
      local_54 = local_54 + 1;
      local_144 = local_144 * fVar33;
      local_148 = local_148 * fVar33;
      local_14c = local_14c * fVar33;
      local_150 = local_150 * fVar33;
      in_RSI[(long)local_4c + 5] = local_144;
      in_RSI[(long)(local_4c + 1) + 5] = local_148;
      in_RSI[(long)(local_4c + 2) + 5] = local_14c;
      in_RSI[(long)(local_4c + 3) + 5] = local_150;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_144),ZEXT416((uint)local_144),
                                ZEXT416((uint)(local_148 * local_148)));
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_14c),ZEXT416((uint)local_14c),auVar18);
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_150),ZEXT416((uint)local_150),auVar18);
      local_50 = auVar18._0_4_ + local_50;
      local_4c = local_4c + 4;
    }
  }
  fVar33 = sqrtf(local_50);
  for (local_19c = 0; local_19c < 0x40; local_19c = local_19c + 1) {
    in_RSI[(long)local_19c + 5] = (1.0 / fVar33) * in_RSI[(long)local_19c + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_1_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}